

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.cpp
# Opt level: O3

int __thiscall
CVmNetFile::get_file_mode
          (CVmNetFile *this,unsigned_long *mode,unsigned_long *attrs,int follow_links)

{
  int iVar1;
  
  if (this->srvfname != (char *)0x0) {
    iVar1 = server_file_check(this->srvfname,"R");
    *mode = (ulong)(uint)(iVar1 << 0xf);
    return iVar1;
  }
  iVar1 = osfmode(this->lclfname,follow_links,mode,attrs);
  return iVar1;
}

Assistant:

int CVmNetFile::get_file_mode(
    VMG_ unsigned long *mode, unsigned long *attrs, int follow_links)
{
    /* 
     *   if it's a network file, check with the server to see if the file
     *   exists; otherwise check the local file system 
     */
    int ret;
    if (is_net_file())
    {
        /* 
         *   network file - if the file exists, it's simply a regular file,
         *   since that's all we support 
         */
        ret = server_file_check(vmg_ srvfname, "R");
        *mode = (ret ? OSFMODE_FILE : 0);
    }
    else
    {
        /* local file - get the local file mode */
        ret = osfmode(lclfname, follow_links, mode, attrs);
    }
    
    /* return the result */
    return ret;
}